

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
vkt::ssbo::anon_unknown_15::computeBufferSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ShaderInterface *interface,
          BufferLayout *layout)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_type __n;
  BufferBlock *this;
  const_reference entry;
  uint *puVar5;
  ulong uVar6;
  int local_cc;
  int local_c4;
  int local_b8;
  int stride;
  int lastArraySize;
  bool isLastUnsized;
  int baseSize;
  BlockLayoutEntry *blockLayout;
  undefined1 local_70 [4];
  int blockNdx;
  string apiName;
  int instanceNdx;
  int numInstances;
  bool isArray;
  BufferBlock *block;
  int declNdx;
  allocator<int> local_22;
  undefined1 local_21;
  BufferLayout *local_20;
  BufferLayout *layout_local;
  ShaderInterface *interface_local;
  vector<int,_std::allocator<int>_> *sizes;
  
  local_21 = 0;
  local_20 = layout;
  layout_local = (BufferLayout *)interface;
  interface_local = (ShaderInterface *)__return_storage_ptr__;
  __n = std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::size
                  (&layout->blocks);
  std::allocator<int>::allocator(&local_22);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_22);
  std::allocator<int>::~allocator(&local_22);
  block._0_4_ = 0;
  while( true ) {
    uVar3 = ShaderInterface::getNumBlocks((ShaderInterface *)layout_local);
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 <= (int)block) break;
    this = ShaderInterface::getBlock((ShaderInterface *)layout_local,(int)block);
    bVar2 = BufferBlock::isArray(this);
    if (bVar2) {
      local_b8 = BufferBlock::getArraySize(this);
    }
    else {
      local_b8 = 1;
    }
    for (apiName.field_2._12_4_ = 0; (int)apiName.field_2._12_4_ < local_b8;
        apiName.field_2._12_4_ = apiName.field_2._12_4_ + 1) {
      ssbo::(anonymous_namespace)::getBlockAPIName_abi_cxx11_
                ((string *)local_70,(_anonymous_namespace_ *)this,
                 (BufferBlock *)(ulong)(uint)apiName.field_2._12_4_,(int)uVar6);
      iVar4 = BufferLayout::getBlockIndex(local_20,(string *)local_70);
      if (-1 < iVar4) {
        entry = std::
                vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
                operator[](&local_20->blocks,(long)iVar4);
        iVar1 = entry->size;
        bVar2 = hasUnsizedArray(local_20,entry);
        if (bVar2) {
          local_c4 = BufferBlock::getLastUnsizedArraySize(this,apiName.field_2._12_4_);
          local_cc = getUnsizedArrayStride(local_20,entry);
        }
        else {
          local_c4 = 0;
          local_cc = 0;
        }
        uVar3 = iVar1 + local_c4 * local_cc;
        puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (__return_storage_ptr__,(long)iVar4);
        uVar6 = (ulong)uVar3;
        *puVar5 = uVar3;
      }
      std::__cxx11::string::~string((string *)local_70);
    }
    block._0_4_ = (int)block + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> computeBufferSizes (const ShaderInterface& interface, const BufferLayout& layout)
{
	vector<int> sizes(layout.blocks.size());

	for (int declNdx = 0; declNdx < interface.getNumBlocks(); declNdx++)
	{
		const BufferBlock&	block			= interface.getBlock(declNdx);
		const bool			isArray			= block.isArray();
		const int			numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			const string	apiName		= getBlockAPIName(block, instanceNdx);
			const int		blockNdx	= layout.getBlockIndex(apiName);

			if (blockNdx >= 0)
			{
				const BlockLayoutEntry&		blockLayout		= layout.blocks[blockNdx];
				const int					baseSize		= blockLayout.size;
				const bool					isLastUnsized	= hasUnsizedArray(layout, blockLayout);
				const int					lastArraySize	= isLastUnsized ? block.getLastUnsizedArraySize(instanceNdx) : 0;
				const int					stride			= isLastUnsized ? getUnsizedArrayStride(layout, blockLayout) : 0;

				sizes[blockNdx] = baseSize + lastArraySize*stride;
			}
		}
	}

	return sizes;
}